

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_changeColsIntegralityByMask(void *highs,HighsInt *mask,HighsInt *integrality)

{
  HighsStatus HVar1;
  reference pvVar2;
  long in_RDX;
  HighsInt iCol;
  vector<HighsVarType,_std::allocator<HighsVarType>_> pass_integrality;
  HighsInt num__col;
  HighsVarType *in_stack_000000c8;
  HighsInt *in_stack_000000d0;
  Highs *in_stack_000000d8;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar3;
  undefined4 in_stack_ffffffffffffffbc;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_ffffffffffffffc0;
  vector<HighsVarType,_std::allocator<HighsVarType>_> local_38;
  int local_1c;
  long local_18;
  
  local_18 = in_RDX;
  local_1c = Highs_getNumCol((void *)0x43999d);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x4399ab);
  if (0 < local_1c) {
    std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
              (in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    for (iVar3 = 0; iVar3 < local_1c; iVar3 = iVar3 + 1) {
      in_stack_ffffffffffffffb4 =
           CONCAT13((char)*(undefined4 *)(local_18 + (long)iVar3 * 4),
                    (int3)in_stack_ffffffffffffffb4);
      pvVar2 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                         (&local_38,(long)iVar3);
      *pvVar2 = (value_type)((uint)in_stack_ffffffffffffffb4 >> 0x18);
    }
  }
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::data
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x439a42);
  HVar1 = Highs::changeColsIntegrality(in_stack_000000d8,in_stack_000000d0,in_stack_000000c8);
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             CONCAT44(in_stack_ffffffffffffffb4,HVar1));
  return HVar1;
}

Assistant:

HighsInt Highs_changeColsIntegralityByMask(void* highs, const HighsInt* mask,
                                           const HighsInt* integrality) {
  const HighsInt num__col = Highs_getNumCol(highs);
  vector<HighsVarType> pass_integrality;
  if (num__col > 0) {
    pass_integrality.resize(num__col);
    for (HighsInt iCol = 0; iCol < num__col; iCol++) {
      pass_integrality[iCol] = (HighsVarType)integrality[iCol];
    }
  }
  return (HighsInt)((Highs*)highs)
      ->changeColsIntegrality(mask, pass_integrality.data());
}